

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeSTRPreImm(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  DecodeStatus DVar7;
  MCInst *in_RCX;
  uint32_t in_ESI;
  uint imm;
  uint Rt;
  uint Rn;
  uint pred;
  DecodeStatus S;
  uint64_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar4 = fieldFromInstruction_4(in_ESI,0,0xc);
  uVar5 = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar6 = uVar5 << 0xd | uVar4;
  uVar4 = fieldFromInstruction_4(in_ESI,0x17,1);
  uVar6 = uVar4 << 0xc | uVar6;
  fieldFromInstruction_4(in_ESI,0x1c,4);
  if ((uVar2 == 0xf) || (uVar2 == uVar3)) {
    local_4 = MCDisassembler_SoftFail;
  }
  DVar7 = DecodeGPRRegisterClass
                    (in_RCX,local_4,CONCAT44(uVar2,uVar3),
                     (void *)CONCAT44(uVar6,in_stack_ffffffffffffffc0));
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
  if (_Var1) {
    DVar7 = DecodeGPRRegisterClass
                      (in_RCX,local_4,CONCAT44(uVar2,uVar3),
                       (void *)CONCAT44(uVar6,in_stack_ffffffffffffffc0));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
    if (_Var1) {
      DVar7 = DecodeAddrModeImm12Operand
                        (in_RCX,local_4,CONCAT44(uVar2,uVar3),
                         (void *)CONCAT44(uVar6,in_stack_ffffffffffffffc0));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
      if (_Var1) {
        DVar7 = DecodePredicateOperand
                          ((MCInst *)CONCAT44(uVar2,uVar3),uVar6,in_stack_ffffffffffffffb8,
                           (void *)0x29893e);
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
        if (!_Var1) {
          local_4 = MCDisassembler_Fail;
        }
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeSTRPreImm(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned pred;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	imm |= fieldFromInstruction_4(Insn, 16, 4) << 13;
	imm |= fieldFromInstruction_4(Insn, 23, 1) << 12;
	pred = fieldFromInstruction_4(Insn, 28, 4);

	if (Rn == 0xF || Rn == Rt) S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeAddrModeImm12Operand(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}